

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fRboStateQueryTests.cpp
# Opt level: O3

void __thiscall deqp::gles3::Functional::anon_unknown_1::RboSamplesCase::test(RboSamplesCase *this)

{
  CallLogWrapper *this_00;
  ostringstream *this_01;
  TestContext *testCtx;
  int iVar1;
  bool bVar2;
  int samples;
  GLuint renderbufferID;
  StateQueryMemoryWriteGuard<int> max_samples;
  GLuint local_1cc;
  StateQueryMemoryWriteGuard<int> local_1c8;
  StateQueryMemoryWriteGuard<int> local_1bc;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  local_1cc = 0;
  this_00 = &(this->super_ApiCase).super_CallLogWrapper;
  glu::CallLogWrapper::glGenRenderbuffers(this_00,1,&local_1cc);
  glu::CallLogWrapper::glBindRenderbuffer(this_00,0x8d41,local_1cc);
  ApiCase::expectError(&this->super_ApiCase,0);
  checkRenderbufferParam
            ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,this_00,
             0x8cab,0);
  ApiCase::expectError(&this->super_ApiCase,0);
  local_1bc.m_preguard = -0x21212122;
  local_1bc.m_value = -0x21212122;
  local_1bc.m_postguard = -0x21212122;
  glu::CallLogWrapper::glGetIntegerv(this_00,0x8d57,&local_1bc.m_value);
  bVar2 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::verifyValidity
                    (&local_1bc,
                     (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx);
  if (bVar2) {
    glu::CallLogWrapper::glRenderbufferStorageMultisample(this_00,0x8d41,0,0x8058,0x80,0x80);
    ApiCase::expectError(&this->super_ApiCase,0);
    checkRenderbufferParam
              ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,this_00,
               0x8cab,0);
    if (0 < local_1bc.m_value) {
      this_01 = (ostringstream *)(local_1b0 + 8);
      samples = 1;
      do {
        glu::CallLogWrapper::glRenderbufferStorageMultisample
                  (this_00,0x8d41,samples,0x8058,0x80,0x80);
        ApiCase::expectError(&this->super_ApiCase,0);
        testCtx = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
        local_1c8.m_preguard = -0x21212122;
        local_1c8.m_value = -0x21212122;
        local_1c8.m_postguard = -0x21212122;
        glu::CallLogWrapper::glGetRenderbufferParameteriv(this_00,0x8d41,0x8cab,&local_1c8.m_value);
        bVar2 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::verifyValidity
                          (&local_1c8,testCtx);
        if ((bVar2) && (iVar1 = local_1c8.m_value, local_1c8.m_value < samples)) {
          local_1b0._0_8_ = testCtx->m_log;
          std::__cxx11::ostringstream::ostringstream(this_01);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)this_01,"// ERROR: Expected greater or equal to ",0x27);
          std::ostream::operator<<(this_01,samples);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,"; got ",6);
          std::ostream::operator<<(this_01,iVar1);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(this_01);
          std::ios_base::~ios_base(local_138);
          if (testCtx->m_testResult == QP_TEST_RESULT_PASS) {
            tcu::TestContext::setTestResult(testCtx,QP_TEST_RESULT_FAIL,"got invalid value");
          }
        }
        samples = samples + 1;
      } while (samples <= local_1bc.m_value);
    }
    glu::CallLogWrapper::glDeleteRenderbuffers(this_00,1,&local_1cc);
  }
  return;
}

Assistant:

void test (void)
	{
		GLuint renderbufferID = 0;
		glGenRenderbuffers(1, &renderbufferID);
		glBindRenderbuffer(GL_RENDERBUFFER, renderbufferID);
		expectError(GL_NO_ERROR);

		checkRenderbufferParam(m_testCtx, *this, GL_RENDERBUFFER_SAMPLES, 0);
		expectError(GL_NO_ERROR);

		StateQueryMemoryWriteGuard<GLint> max_samples;
		glGetIntegerv(GL_MAX_SAMPLES, &max_samples);
		if (!max_samples.verifyValidity(m_testCtx))
			return;

		// 0 samples is a special case
		{
			glRenderbufferStorageMultisample(GL_RENDERBUFFER, 0, GL_RGBA8, 128, 128);
			expectError(GL_NO_ERROR);

			checkRenderbufferParam(m_testCtx, *this, GL_RENDERBUFFER_SAMPLES, 0);
		}

		// test [1, n] samples
		for (int samples = 1; samples <= max_samples; ++samples)
		{
			glRenderbufferStorageMultisample(GL_RENDERBUFFER, samples, GL_RGBA8, 128, 128);
			expectError(GL_NO_ERROR);

			checkRenderbufferParamGreaterOrEqual(m_testCtx, *this, GL_RENDERBUFFER_SAMPLES, samples);
		}

		glDeleteRenderbuffers(1, &renderbufferID);
	}